

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUISetting.cpp
# Opt level: O2

void __thiscall GUISetting::GUISetting(GUISetting *this,Fifteen *owner,BoardMode boardMode)

{
  map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
  *this_01;
  _Rb_tree_header *p_Var2;
  map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
  *this_02;
  map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
  *this_03;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  QButtonGroup *pQVar7;
  QVBoxLayout *pQVar8;
  QGroupBox *this_04;
  mapped_type *pmVar9;
  QGroupBox *this_05;
  QSlider *pQVar10;
  QGridLayout *this_06;
  QLabel *pQVar11;
  QGroupBox *this_07;
  QPushButton *this_08;
  QHBoxLayout *this_09;
  WidgetAttribute WVar12;
  int iVar13;
  QVBoxLayout layWindow;
  undefined4 uStack_a4;
  char16_t *pcStack_a0;
  NumberColor local_98;
  QArrayDataPointer<char16_t> local_58;
  _Rb_tree_node_base *local_40;
  QObject local_38 [8];
  
  QDialog::QDialog(&this->super_QDialog,0,0);
  *(undefined ***)this = &PTR_metaObject_001227c0;
  *(undefined ***)&this->field_0x10 = &PTR__GUISetting_00122998;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_00 = &this->mapGraphicMode;
  p_Var1 = &(this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapGraphicMode)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &this->mapImageToLoad;
  p_Var1 = &(this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = &(this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_40;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_40;
  (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_02 = &this->mapNumberOnImage;
  this_03 = &this->mapTileColor;
  this->owner = owner;
  this->boardMode = boardMode;
  QDialog::setModal(SUB81(this,0));
  QString::QString((QString *)&layWindow,"");
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  QWidget::setGeometry((QWidget *)this,100,100,400,0x230);
  WVar12 = (WidgetAttribute)this;
  QWidget::setMaximumSize(WVar12,400);
  QWidget::setMinimumSize(WVar12,400);
  QWidget::setAttribute(WVar12,true);
  Options::readOptions();
  (this->currentOptions).numberColor = local_98;
  (this->currentOptions).graphicMode = _layWindow;
  (this->currentOptions).imageToLoad_4 = (bool)(char)uStack_a4;
  (this->currentOptions).imageToLoad_5 = (bool)(char)((uint)uStack_a4 >> 8);
  (this->currentOptions).imageToLoad_6 = (bool)(char)((uint)uStack_a4 >> 0x10);
  (this->currentOptions).imageToLoad_7 = (bool)(char)((uint)uStack_a4 >> 0x18);
  *(char16_t **)&(this->currentOptions).squareColor = pcStack_a0;
  _layWindow = 0;
  std::
  _Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
  ::_M_emplace_unique<GraphicMode,char_const(&)[14]>
            ((_Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
              *)this_00,(GraphicMode *)&layWindow,(char (*) [14])"Scalled image");
  local_58.d._0_4_ = 0;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)&local_58);
  QString::QString((QString *)&layWindow,"margin-left: 5px");
  QWidget::setStyleSheet((QString *)pmVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  _layWindow = 1;
  std::
  _Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
  ::_M_emplace_unique<GraphicMode,char_const(&)[14]>
            ((_Rb_tree<GraphicMode,std::pair<GraphicMode_const,QRadioButton>,std::_Select1st<std::pair<GraphicMode_const,QRadioButton>>,std::less<GraphicMode>,std::allocator<std::pair<GraphicMode_const,QRadioButton>>>
              *)this_00,(GraphicMode *)&layWindow,(char (*) [14])"Cropped image");
  local_58.d._0_4_ = 1;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)&local_58);
  QString::QString((QString *)&layWindow,"margin-left: 5px");
  QWidget::setStyleSheet((QString *)pmVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](this_00,&(this->currentOptions).graphicMode);
  QAbstractButton::setChecked(SUB81(pmVar3,0));
  _layWindow = 0;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
              *)this_01,(BoardSize *)&layWindow,(char (*) [26])"Load image for board  4x4");
  _layWindow = 0;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  _layWindow = 1;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
              *)this_01,(BoardSize *)&layWindow,(char (*) [26])"Load Image for board  5x5");
  _layWindow = 1;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  _layWindow = 2;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
              *)this_01,(BoardSize *)&layWindow,(char (*) [26])"Load image for board  6x6");
  _layWindow = 2;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  _layWindow = 3;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[26]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QCheckBox>,std::_Select1st<std::pair<BoardSize_const,QCheckBox>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QCheckBox>>>
              *)this_01,(BoardSize *)&layWindow,(char (*) [26])"Load image for board  7x7");
  _layWindow = 3;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  for (p_Var5 = (this->mapImageToLoad)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    QString::QString((QString *)&layWindow,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)&p_Var5[1]._M_parent);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  }
  _layWindow = 0;
  std::
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::_M_emplace_unique<NumberColor,char_const(&)[28]>
            ((_Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
              *)this_02,(NumberColor *)&layWindow,(char (*) [28])"Number on graphic tile : No");
  _layWindow = 1;
  std::
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::_M_emplace_unique<NumberColor,char_const(&)[31]>
            ((_Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
              *)this_02,(NumberColor *)&layWindow,(char (*) [31])"Number on graphic tile : Black");
  _layWindow = 2;
  std::
  _Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
  ::_M_emplace_unique<NumberColor,char_const(&)[31]>
            ((_Rb_tree<NumberColor,std::pair<NumberColor_const,QRadioButton>,std::_Select1st<std::pair<NumberColor_const,QRadioButton>>,std::less<NumberColor>,std::allocator<std::pair<NumberColor_const,QRadioButton>>>
              *)this_02,(NumberColor *)&layWindow,(char (*) [31])"Number on graphic tile : White");
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](this_02,&(this->currentOptions).numberColor);
  QAbstractButton::setChecked(SUB81(pmVar6,0));
  pQVar7 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar7,(QObject *)0x0);
  for (p_Var5 = (this->mapNumberOnImage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var2; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    QString::QString((QString *)&layWindow,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)&p_Var5[1]._M_parent);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
    QButtonGroup::addButton((QAbstractButton *)pQVar7,(int)&p_Var5[1]._M_parent);
  }
  pQVar8 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar8);
  iVar13 = (int)pQVar8;
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 0;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar3,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 1;
  pmVar3 = std::
           map<GraphicMode,_QRadioButton,_std::less<GraphicMode>,_std::allocator<std::pair<const_GraphicMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar3,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 0;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar4,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 1;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar4,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 2;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar4,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 3;
  pmVar4 = std::
           map<BoardSize,_QCheckBox,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QCheckBox>_>_>
           ::operator[](this_01,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar4,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 0;
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](this_02,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 1;
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](this_02,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 2;
  pmVar6 = std::
           map<NumberColor,_QRadioButton,_std::less<NumberColor>,_std::allocator<std::pair<const_NumberColor,_QRadioButton>_>_>
           ::operator[](this_02,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar6,0,0);
  QBoxLayout::addSpacing(iVar13);
  this_04 = (QGroupBox *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"Image for a graphic board");
  QGroupBox::QGroupBox(this_04,(QString *)&layWindow,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  QWidget::setLayout((QLayout *)this_04);
  _layWindow = 0;
  std::
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::_M_emplace_unique<TileColor,char_const(&)[5]>
            ((_Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
              *)this_03,(TileColor *)&layWindow,(char (*) [5])"Blue");
  _layWindow = 1;
  std::
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::_M_emplace_unique<TileColor,char_const(&)[6]>
            ((_Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
              *)this_03,(TileColor *)&layWindow,(char (*) [6])"Green");
  _layWindow = 2;
  std::
  _Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
  ::_M_emplace_unique<TileColor,char_const(&)[4]>
            ((_Rb_tree<TileColor,std::pair<TileColor_const,QRadioButton>,std::_Select1st<std::pair<TileColor_const,QRadioButton>>,std::less<TileColor>,std::allocator<std::pair<TileColor_const,QRadioButton>>>
              *)this_03,(TileColor *)&layWindow,(char (*) [4])"Red");
  pmVar9 = std::
           map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
           ::operator[](this_03,&(this->currentOptions).squareColor);
  QAbstractButton::setChecked(SUB81(pmVar9,0));
  pQVar7 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar7,(QObject *)0x0);
  for (p_Var5 = (this->mapTileColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != local_40; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    QString::QString((QString *)&layWindow,"margin-left: 5px");
    QWidget::setStyleSheet((QString *)&p_Var5[1]._M_parent);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
    QButtonGroup::addButton((QAbstractButton *)pQVar7,(int)&p_Var5[1]._M_parent);
  }
  pQVar8 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar8);
  iVar13 = (int)pQVar8;
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 0;
  pmVar9 = std::
           map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
           ::operator[](this_03,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar9,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 1;
  pmVar9 = std::
           map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
           ::operator[](this_03,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar9,0,0);
  QBoxLayout::addSpacing(iVar13);
  _layWindow = 2;
  pmVar9 = std::
           map<TileColor,_QRadioButton,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_QRadioButton>_>_>
           ::operator[](this_03,(key_type *)&layWindow);
  QBoxLayout::addWidget(pQVar8,pmVar9,0,0);
  QBoxLayout::addSpacing(iVar13);
  this_05 = (QGroupBox *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"Color of numeric board");
  QGroupBox::QGroupBox(this_05,(QString *)&layWindow,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  QWidget::setLayout((QLayout *)this_05);
  pQVar10 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar10,Horizontal,(QWidget *)this);
  this->slider = pQVar10;
  QAbstractSlider::setRange((int)pQVar10,0);
  QAbstractSlider::setSingleStep((int)this->slider);
  pQVar10 = this->slider;
  Maps::getSliderByTileSize((this->currentOptions).tileSize);
  QAbstractSlider::setValue((int)pQVar10);
  this_06 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_06,(QWidget *)0x0);
  QLayout::setContentsMargins((int)this_06,10,0x14,0x1e);
  QGridLayout::addWidget(this_06,this->slider,0,0,1,5,0);
  pQVar11 = (QLabel *)operator_new(0x28);
  QString::QString((QString *)&layWindow," 50");
  QLabel::QLabel(pQVar11,&layWindow,0,0);
  QGridLayout::addWidget(this_06,pQVar11,1,0,1,1,1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  pQVar11 = (QLabel *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"   75");
  QLabel::QLabel(pQVar11,&layWindow,0,0);
  QGridLayout::addWidget(this_06,pQVar11,1,1,1,1,1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  pQVar11 = (QLabel *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"100");
  QLabel::QLabel(pQVar11,&layWindow,0,0);
  QGridLayout::addWidget(this_06,pQVar11,1,2,1,1,0x84);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  pQVar11 = (QLabel *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"125  ");
  QLabel::QLabel(pQVar11,&layWindow,0,0);
  QGridLayout::addWidget(this_06,pQVar11,1,3,1,1,2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  pQVar11 = (QLabel *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"150");
  QLabel::QLabel(pQVar11,&layWindow,0,0);
  QGridLayout::addWidget(this_06,pQVar11,1,4,1,1,2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  this_07 = (QGroupBox *)operator_new(0x28);
  QString::QString((QString *)&layWindow,"Size of tile");
  QGroupBox::QGroupBox(this_07,(QString *)&layWindow,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&layWindow);
  QWidget::setLayout((QLayout *)this_07);
  QVBoxLayout::QVBoxLayout(&layWindow);
  this_08 = (QPushButton *)operator_new(0x28);
  QString::QString((QString *)&local_58,"Accept");
  QPushButton::QPushButton(this_08,(QString *)&local_58,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QString::QString((QString *)&local_58,"height:20px;");
  QWidget::setStyleSheet((QString *)this_08);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QObject::connect(local_38,(char *)this_08,(QObject *)"2clicked()",(char *)this,0x116d40);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  this_09 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_09);
  iVar13 = (int)this_09;
  QBoxLayout::addSpacing(iVar13);
  QBoxLayout::addWidget(this_09,this_08,0,0);
  QBoxLayout::addSpacing(iVar13);
  QBoxLayout::addSpacing((int)&layWindow);
  QBoxLayout::addWidget(&layWindow,this_04,0,0);
  QBoxLayout::addSpacing((int)&layWindow);
  QBoxLayout::addWidget(&layWindow,this_05,0,0);
  QBoxLayout::addSpacing((int)&layWindow);
  QBoxLayout::addWidget(&layWindow,this_07,0,0);
  QBoxLayout::addSpacing((int)&layWindow);
  QBoxLayout::addLayout((QLayout *)&layWindow,iVar13);
  QBoxLayout::addSpacing((int)&layWindow);
  QBoxLayout::addStretch((int)&layWindow);
  QWidget::setLayout((QLayout *)this);
  QWidget::show();
  QVBoxLayout::~QVBoxLayout(&layWindow);
  return;
}

Assistant:

GUISetting::GUISetting( Fifteen& owner, BoardMode boardMode ) : owner( owner ), boardMode( boardMode )
{
    setModal( true );
    setWindowTitle( "" );
    setGeometry( 100, 100, 400, 560 );
    setMaximumSize( 400, 800 );
    setMinimumSize( 400, 800 );
    setAttribute( Qt::WA_DeleteOnClose );

    currentOptions = Options::readOptions();

    /* Graphic loading box *****************************************/

    mapGraphicMode.emplace( GraphicMode::SCALED, "Scalled image");
    mapGraphicMode[GraphicMode::SCALED].setStyleSheet( STYLE_MARGIN_LEFT );
    
    mapGraphicMode.emplace( GraphicMode::CROPPED, "Cropped image" );
    mapGraphicMode[GraphicMode::CROPPED].setStyleSheet( STYLE_MARGIN_LEFT );
    mapGraphicMode[currentOptions.graphicMode].setChecked( true );

    mapImageToLoad.emplace( BoardSize::FOUR, "Load image for board  4x4" );
    mapImageToLoad[BoardSize::FOUR].setChecked( currentOptions.imageToLoad_4 );
    
    mapImageToLoad.emplace( BoardSize::FIVE, "Load Image for board  5x5" );
    mapImageToLoad[BoardSize::FIVE].setChecked( currentOptions.imageToLoad_5 );
    
    mapImageToLoad.emplace( BoardSize::SIX, "Load image for board  6x6" );
    mapImageToLoad[BoardSize::SIX].setChecked( currentOptions.imageToLoad_6 );
    
    mapImageToLoad.emplace( BoardSize::SEVEN, "Load image for board  7x7" );
    mapImageToLoad[BoardSize::SEVEN].setChecked( currentOptions.imageToLoad_7 );

    for ( auto& checkBox : mapImageToLoad | std::views::values )
    {
        checkBox.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    mapNumberOnImage.emplace( NumberColor::NO, "Number on graphic tile : No" );
    mapNumberOnImage.emplace( NumberColor::BLACK, "Number on graphic tile : Black" );
    mapNumberOnImage.emplace( NumberColor::WHITE, "Number on graphic tile : White" );
    mapNumberOnImage[currentOptions.numberColor].setChecked( true );

    QButtonGroup* groupNumberOnImage = new QButtonGroup();
    for ( auto& radio : mapNumberOnImage | std::views::values )
    {
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
        groupNumberOnImage->addButton( &radio );
    }

    QVBoxLayout* layoutImages = new QVBoxLayout();
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapGraphicMode[GraphicMode::SCALED] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapGraphicMode[GraphicMode::CROPPED] );
    layoutImages->addSpacing( 15 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::FOUR] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::FIVE] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::SIX] );
    layoutImages->addSpacing( 8 );
    layoutImages->addWidget( &mapImageToLoad[BoardSize::SEVEN] );
    layoutImages->addSpacing( 15 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::NO] );
    layoutImages->addSpacing( 12 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::BLACK] );
    layoutImages->addSpacing( 12 );
    layoutImages->addWidget( &mapNumberOnImage[NumberColor::WHITE] );
    layoutImages->addSpacing( 15 );

    QGroupBox* boxRadioImage = new QGroupBox( "Image for a graphic board" );
    boxRadioImage->setLayout( layoutImages );

    /* Color of numeric board **************************************/

    mapTileColor.emplace(TileColor::BLUE, "Blue" );
    mapTileColor.emplace(TileColor::GREEN, "Green" );
    mapTileColor.emplace(TileColor::RED, "Red" );
    mapTileColor[currentOptions.squareColor].setChecked( true );

    QButtonGroup* groupRadioColor = new QButtonGroup();
    for ( auto& radio : mapTileColor | std::views::values )
    {
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
        groupRadioColor->addButton( &radio );
    }   

    QVBoxLayout* layoutTileColor = new QVBoxLayout();
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::BLUE] );
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::GREEN] );
    layoutTileColor->addSpacing( 7 );
    layoutTileColor->addWidget( &mapTileColor[TileColor::RED] );
    layoutTileColor->addSpacing( 7 );

    QGroupBox* boxRadioColor = new QGroupBox( "Color of numeric board" );
    boxRadioColor->setLayout( layoutTileColor );

    /* Slider for square size **************************************/

    slider = new QSlider( Qt::Horizontal, this );
    slider->setRange( 0, 4 );
    slider->setSingleStep( 1 );
    slider->setValue( Maps::getSliderByTileSize( currentOptions.tileSize ));

    QGridLayout* layoutSlider = new QGridLayout();
    layoutSlider->setContentsMargins( 10, 20, 30, 20 );
    layoutSlider->addWidget( slider,          0, 0, 1, 5 );
    layoutSlider->addWidget( new QLabel( " 50" ),   1, 0, 1, 1, Qt::AlignLeft );
    layoutSlider->addWidget( new QLabel( "   75" ), 1, 1, 1, 1, Qt::AlignLeft );
    layoutSlider->addWidget( new QLabel( "100" ),   1, 2, 1, 1, Qt::AlignCenter );
    layoutSlider->addWidget( new QLabel( "125  " ), 1, 3, 1, 1, Qt::AlignRight );
    layoutSlider->addWidget( new QLabel( "150" ),   1, 4, 1, 1, Qt::AlignRight );

    QGroupBox* boxSquareSize = new QGroupBox( "Size of tile" );
    boxSquareSize->setLayout( layoutSlider );

    /* General layout **********************************************/

    QVBoxLayout layWindow;

    QPushButton* pushAccept = new QPushButton( "Accept" );
    pushAccept->setStyleSheet( "height:20px;" );
    connect( pushAccept, SIGNAL( clicked() ), this, SLOT( acceptSettings() ));

    QHBoxLayout* layoutAccept = new QHBoxLayout();
    layoutAccept->addSpacing( 120 );
    layoutAccept->addWidget( pushAccept );
    layoutAccept->addSpacing( 120 );

    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxRadioImage );
    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxRadioColor);
    layWindow.addSpacing( 20 );
    layWindow.addWidget( boxSquareSize );
    layWindow.addSpacing( 20 );
    layWindow.addLayout( layoutAccept );
    layWindow.addSpacing( 10 );
    layWindow.addStretch();

    this->setLayout( &layWindow );
    this->show();
}